

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

DenseMapPair<DBKeyID,_llbuild::core::KeyID> * __thiscall
llvm::
DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
::InsertIntoBucketImpl<DBKeyID>
          (DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
           *this,DBKeyID *Key,DBKeyID *Lookup,DenseMapPair<DBKeyID,_llbuild::core::KeyID> *TheBucket
          )

{
  uint AtLeast;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *local_18;
  
  AtLeast = *(uint *)(this + 0x10);
  local_18 = TheBucket;
  if (*(uint *)(this + 8) * 4 + 4 < AtLeast * 3) {
    if (AtLeast >> 3 < (~*(uint *)(this + 8) + AtLeast) - *(int *)(this + 0xc)) goto LAB_001586ce;
  }
  else {
    AtLeast = AtLeast * 2;
  }
  DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
  ::grow((DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
          *)this,AtLeast);
  LookupBucketFor<DBKeyID>(this,Lookup,&local_18);
LAB_001586ce:
  if (local_18 != (DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)0x0) {
    *(int *)(this + 8) = *(int *)(this + 8) + 1;
    if ((local_18->super_pair<DBKeyID,_llbuild::core::KeyID>).first.value != 0xffffffffffffffff) {
      *(int *)(this + 0xc) = *(int *)(this + 0xc) + -1;
    }
    return local_18;
  }
  __assert_fail("TheBucket",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                ,0x22a,
                "BucketT *llvm::DenseMapBase<llvm::DenseMap<DBKeyID, llbuild::core::KeyID>, DBKeyID, llbuild::core::KeyID, llvm::DenseMapInfo<DBKeyID>, llvm::detail::DenseMapPair<DBKeyID, llbuild::core::KeyID>>::InsertIntoBucketImpl(const KeyT &, const LookupKeyT &, BucketT *) [DerivedT = llvm::DenseMap<DBKeyID, llbuild::core::KeyID>, KeyT = DBKeyID, ValueT = llbuild::core::KeyID, KeyInfoT = llvm::DenseMapInfo<DBKeyID>, BucketT = llvm::detail::DenseMapPair<DBKeyID, llbuild::core::KeyID>, LookupKeyT = DBKeyID]"
               );
}

Assistant:

BucketT *InsertIntoBucketImpl(const KeyT &Key, const LookupKeyT &Lookup,
                                BucketT *TheBucket) {
    incrementEpoch();

    // If the load of the hash table is more than 3/4, or if fewer than 1/8 of
    // the buckets are empty (meaning that many are filled with tombstones),
    // grow the table.
    //
    // The later case is tricky.  For example, if we had one empty bucket with
    // tons of tombstones, failing lookups (e.g. for insertion) would have to
    // probe almost the entire table until it found the empty bucket.  If the
    // table completely filled with tombstones, no lookup would ever succeed,
    // causing infinite loops in lookup.
    unsigned NewNumEntries = getNumEntries() + 1;
    unsigned NumBuckets = getNumBuckets();
    if (LLVM_UNLIKELY(NewNumEntries * 4 >= NumBuckets * 3)) {
      this->grow(NumBuckets * 2);
      LookupBucketFor(Lookup, TheBucket);
      NumBuckets = getNumBuckets();
    } else if (LLVM_UNLIKELY(NumBuckets-(NewNumEntries+getNumTombstones()) <=
                             NumBuckets/8)) {
      this->grow(NumBuckets);
      LookupBucketFor(Lookup, TheBucket);
    }
    assert(TheBucket);

    // Only update the state after we've grown our bucket space appropriately
    // so that when growing buckets we have self-consistent entry count.
    incrementNumEntries();

    // If we are writing over a tombstone, remember this.
    const KeyT EmptyKey = getEmptyKey();
    if (!KeyInfoT::isEqual(TheBucket->getFirst(), EmptyKey))
      decrementNumTombstones();

    return TheBucket;
  }